

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_plastic.hpp
# Opt level: O1

Color __thiscall RoughPlasticBSDF::f(RoughPlasticBSDF *this,Color *albedo,vec3f *wo,vec3f *wi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  Color CVar33;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  float local_68;
  float fStack_64;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  fVar14 = ABS(wo->z);
  fVar17 = 1.0 - fVar14 * fVar14;
  if (fVar17 <= 0.0) {
    fVar17 = 0.0;
  }
  fVar28 = *(float *)&(this->super_BSDF).field_0x24;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  fVar17 = fVar17 / fVar28;
  fVar19 = 1.0;
  if (fVar17 < 1.0) {
    fVar17 = 1.0 - fVar17 * fVar17;
    if (fVar17 < 0.0) {
      fVar17 = sqrtf(fVar17);
    }
    else {
      fVar17 = SQRT(fVar17);
    }
    fVar19 = (fVar28 * fVar14 - fVar17) / (fVar28 * fVar14 + fVar17);
    fVar17 = (fVar14 - fVar28 * fVar17) / (fVar28 * fVar17 + fVar14);
    fVar19 = (fVar17 * fVar17 + fVar19 * fVar19) * 0.5;
  }
  fVar17 = 1.0 - wi->z * wi->z;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  fVar14 = 0.0;
  fVar17 = fVar17 / *(float *)&(this->super_BSDF).field_0x24;
  fVar28 = 0.0;
  fVar29 = 0.0;
  if (fVar17 < 1.0) {
    fVar17 = 1.0 - fVar17 * fVar17;
    if (fVar17 < 0.0) {
      fVar17 = sqrtf(fVar17);
    }
    else {
      fVar17 = SQRT(fVar17);
    }
    fVar28 = 1.0 / *(float *)&(this->super_BSDF).field_0x24;
    fVar14 = 1.0 - fVar17 * fVar17;
    if (fVar14 <= 0.0) {
      fVar14 = 0.0;
    }
    if (fVar14 < 0.0) {
      fVar14 = sqrtf(fVar14);
    }
    else {
      fVar14 = SQRT(fVar14);
    }
    fVar14 = fVar14 / fVar28;
    fVar29 = 1.0;
    if (fVar14 < 1.0) {
      fVar14 = 1.0 - fVar14 * fVar14;
      if (fVar14 < 0.0) {
        fVar14 = sqrtf(fVar14);
      }
      else {
        fVar14 = SQRT(fVar14);
      }
      fVar29 = (fVar28 * fVar17 - fVar14) / (fVar28 * fVar17 + fVar14);
      fVar17 = (fVar17 - fVar28 * fVar14) / (fVar28 * fVar14 + fVar17);
      fVar29 = (fVar17 * fVar17 + fVar29 * fVar29) * 0.5;
    }
    fVar28 = PI;
    fVar17 = *(float *)&(this->super_BSDF).field_0x24;
    fVar21 = 1.0 - this->outRatio;
    fVar14 = albedo->z;
    fVar26 = wo->z + wi->z;
    uVar1 = albedo->x;
    uVar7 = albedo->y;
    uVar2 = wo->x;
    uVar8 = wo->y;
    uVar3 = wi->x;
    uVar9 = wi->y;
    fVar24 = (float)uVar3 + (float)uVar2;
    fVar25 = (float)uVar9 + (float)uVar8;
    fVar15 = fVar26 * fVar26 + fVar24 * fVar24 + fVar25 * fVar25;
    if (fVar15 < 0.0) {
      fVar15 = sqrtf(fVar15);
    }
    else {
      fVar15 = SQRT(fVar15);
    }
    fVar15 = 1.0 / fVar15;
    fVar26 = fVar26 * fVar15;
    fVar24 = fVar24 * fVar15;
    fVar25 = fVar25 * fVar15;
    fVar16 = wo->z * fVar26 + wo->x * fVar24 + fVar25 * wo->y;
    fVar15 = *(float *)&(this->super_BSDF).field_0x24;
    fVar18 = 1.0 - fVar16 * fVar16;
    if (fVar18 <= 0.0) {
      fVar18 = 0.0;
    }
    if (fVar18 < 0.0) {
      fVar18 = sqrtf(fVar18);
    }
    else {
      fVar18 = SQRT(fVar18);
    }
    fVar18 = fVar18 / fVar15;
    fVar27 = 1.0;
    if (fVar18 < 1.0) {
      fVar18 = 1.0 - fVar18 * fVar18;
      if (fVar18 < 0.0) {
        fVar18 = sqrtf(fVar18);
      }
      else {
        fVar18 = SQRT(fVar18);
      }
      fVar27 = (fVar15 * fVar16 - fVar18) / (fVar15 * fVar16 + fVar18);
      fVar15 = (fVar16 - fVar15 * fVar18) / (fVar15 * fVar18 + fVar16);
      fVar27 = (fVar15 * fVar15 + fVar27 * fVar27) * 0.5;
    }
    fVar31 = (1.0 - fVar19) * (1.0 - fVar29);
    fVar19 = this->alpha;
    fVar16 = -fVar26;
    fVar15 = fVar26 * fVar26;
    fVar18 = 0.0;
    fVar29 = wo->z;
    local_68 = fVar24;
    fStack_64 = fVar25;
    if (fVar26 < fVar16) {
      local_68 = -fVar24;
      fStack_64 = -fVar25;
    }
    fVar20 = 1.0 / (fVar17 * fVar17);
    local_138._4_4_ = fVar31;
    local_138._0_4_ = fVar31;
    fStack_130 = fVar31;
    fStack_12c = fVar31;
    fVar30 = 1.0 / PI;
    uVar4 = wo->x;
    uVar10 = wo->y;
    uVar5 = wi->x;
    uVar11 = wi->y;
    fVar17 = wi->z;
    fVar32 = 1.0 - fVar29 * fVar29;
    if (0.0 < fVar32) {
      if (fVar32 < 0.0) {
        fVar32 = sqrtf(fVar32);
      }
      else {
        fVar32 = SQRT(fVar32);
      }
      fVar18 = fVar32 / fVar29;
    }
    auVar23._4_4_ = 1.0 - fVar21 * (float)uVar7;
    auVar23._0_4_ = 1.0 - fVar21 * (float)uVar1;
    auVar23._8_4_ = 0.0 - fVar21 * 0.0;
    auVar23._12_4_ = 0.0 - fVar21 * 0.0;
    auVar23 = divps(_local_138,auVar23);
    fVar32 = 0.0;
    if ((fVar18 != 0.0) || (NAN(fVar18))) {
      fVar22 = fVar16;
      if (fVar16 <= fVar26) {
        fVar22 = fVar26;
      }
      if (0.0 < (fVar22 * fVar29 + (float)uVar4 * local_68 + fStack_64 * (float)uVar10) * fVar29) {
        fVar29 = ABS(fVar18) * fVar19 * ABS(fVar18) * fVar19 + 1.0;
        if (fVar29 < 0.0) {
          fVar29 = sqrtf(fVar29);
        }
        else {
          fVar29 = SQRT(fVar29);
        }
        fVar32 = 2.0 / (fVar29 + 1.0);
      }
    }
    else {
      fVar32 = 1.0;
    }
    local_138._0_4_ = auVar23._0_4_;
    local_138._4_4_ = auVar23._4_4_;
    fStack_130 = auVar23._8_4_;
    fStack_12c = auVar23._12_4_;
    local_108._4_4_ = fVar20 * (float)local_138._4_4_;
    local_108._0_4_ = fVar20 * (float)local_138._0_4_;
    fStack_100 = fVar20 * fStack_130;
    fStack_fc = fVar20 * fStack_12c;
    fVar29 = fVar19 / (fVar15 * (fVar19 * fVar19 +
                                (float)(-(uint)(0.0 < 1.0 - fVar15) &
                                       (uint)((1.0 - fVar15) / fVar15))));
    if (fVar26 < 0.0) {
      fVar24 = -fVar24;
      fVar25 = -fVar25;
    }
    auVar13._4_4_ = fVar28;
    auVar13._0_4_ = fVar28;
    auVar13._8_4_ = fVar28;
    auVar13._12_4_ = fVar28;
    auVar23 = divps(_local_108,auVar13);
    fVar15 = 1.0 - fVar17 * fVar17;
    fVar18 = 0.0;
    if (0.0 < fVar15) {
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      fVar18 = fVar15 / fVar17;
    }
    fVar15 = 1.0;
    local_108._0_4_ = auVar23._0_4_;
    local_108._4_4_ = auVar23._4_4_;
    if ((fVar18 != 0.0) || (NAN(fVar18))) {
      fVar15 = 0.0;
      if (0.0 < ((float)(~-(uint)(fVar26 < 0.0) & (uint)fVar26 |
                        (uint)fVar16 & -(uint)(fVar26 < 0.0)) * fVar17 +
                (float)uVar5 * fVar24 + fVar25 * (float)uVar11) * fVar17) {
        fVar17 = fVar19 * ABS(fVar18) * fVar19 * ABS(fVar18) + 1.0;
        if (fVar17 < 0.0) {
          fVar17 = sqrtf(fVar17);
        }
        else {
          fVar17 = SQRT(fVar17);
        }
        fVar15 = 2.0 / (fVar17 + 1.0);
      }
    }
    fVar27 = fVar27 * ((fVar30 * fVar29 * fVar29 * fVar32 * fVar15) / (wo->z * 4.0 * wi->z));
    fVar14 = fVar14 * ((fVar20 * (fVar31 / (1.0 - fVar21 * fVar14))) / fVar28) +
             (this->Ks).z * fVar27;
    uVar6 = (this->Ks).x;
    uVar12 = (this->Ks).y;
    fVar28 = (float)uVar1 * (float)local_108._0_4_ + fVar27 * (float)uVar6;
    fVar29 = (float)uVar7 * (float)local_108._4_4_ + fVar27 * (float)uVar12;
  }
  CVar33.y = fVar29;
  CVar33.x = fVar28;
  CVar33.z = fVar14;
  return CVar33;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const
	{
		float energy = 1;
		energy *= 1 - DielectricBRDF::reflectivity(fabs(wo.z), IOR);
		float sint = sqrtf(1-wi.z*wi.z)/IOR;
		if (sint >= 1) return 0; // total reflect (shouldn't happen if IOR>1)
		float cost = sqrtf(1-sint*sint);
		energy *= 1 - DielectricBRDF::reflectivity(cost, 1/IOR);
		float ratio2 = 1/(IOR*IOR); // see note_refract_radiance
		vec3f diff = energy / (1 - albedo * (1-outRatio)) * ratio2 * 1/PI * albedo;
		// add reflect component
		vec3f wm = normalized(wo+wi); // microfacet normal
		float cos = dot(wm,wo);
		Color Fres = DielectricBRDF::reflectivity(cos, IOR); // reflected energy
		vec3f refl = EDX::GGX_D(wm,alpha) * EDX::Smith_G(wo,wi,wm,alpha) / (4 * wo.z * wi.z) * Fres;
		// console.log(refl, diff);
		return refl * Ks + diff;
	}